

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

cram_block_slice_hdr * cram_decode_slice_header(cram_fd *fd,cram_block *b)

{
  int iVar1;
  void *pvVar2;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_38;
  int local_34;
  int32_t i32;
  int i;
  char *cp;
  cram_block_slice_hdr *hdr;
  cram_block *b_local;
  cram_fd *fd_local;
  
  _i32 = b->data;
  if ((b->content_type == MAPPED_SLICE) || (b->content_type == UNMAPPED_SLICE)) {
    fd_local = (cram_fd *)calloc(1,0x48);
    if (fd_local == (cram_fd *)0x0) {
      fd_local = (cram_fd *)0x0;
    }
    else {
      *(cram_content_type *)&fd_local->fp = b->content_type;
      if (b->content_type == MAPPED_SLICE) {
        if (*_i32 < 0x80) {
          *(uint *)((long)&fd_local->fp + 4) = (uint)*_i32;
          local_3c = 1;
        }
        else {
          if (*_i32 < 0xc0) {
            *(uint *)((long)&fd_local->fp + 4) = CONCAT11(*_i32,_i32[1]) & 0x3fff;
            local_40 = 2;
          }
          else {
            if (*_i32 < 0xe0) {
              *(uint *)((long)&fd_local->fp + 4) =
                   (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
              local_44 = 3;
            }
            else {
              if (*_i32 < 0xf0) {
                *(uint *)((long)&fd_local->fp + 4) =
                     (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                     (uint)_i32[3];
                local_48 = 4;
              }
              else {
                *(uint *)((long)&fd_local->fp + 4) =
                     (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                     (uint)_i32[3] << 4 | _i32[4] & 0xf;
                local_48 = 5;
              }
              local_44 = local_48;
            }
            local_40 = local_44;
          }
          local_3c = local_40;
        }
        _i32 = _i32 + local_3c;
        if (*_i32 < 0x80) {
          fd_local->mode = (uint)*_i32;
          local_4c = 1;
        }
        else {
          if (*_i32 < 0xc0) {
            fd_local->mode = CONCAT11(*_i32,_i32[1]) & 0x3fff;
            local_50 = 2;
          }
          else {
            if (*_i32 < 0xe0) {
              fd_local->mode = (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
              local_54 = 3;
            }
            else {
              if (*_i32 < 0xf0) {
                fd_local->mode =
                     (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                     (uint)_i32[3];
                local_58 = 4;
              }
              else {
                fd_local->mode =
                     (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                     (uint)_i32[3] << 4 | _i32[4] & 0xf;
                local_58 = 5;
              }
              local_54 = local_58;
            }
            local_50 = local_54;
          }
          local_4c = local_50;
        }
        _i32 = _i32 + local_4c;
        if (*_i32 < 0x80) {
          fd_local->version = (uint)*_i32;
          local_5c = 1;
        }
        else {
          if (*_i32 < 0xc0) {
            fd_local->version = CONCAT11(*_i32,_i32[1]) & 0x3fff;
            local_60 = 2;
          }
          else {
            if (*_i32 < 0xe0) {
              fd_local->version = (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
              local_64 = 3;
            }
            else {
              if (*_i32 < 0xf0) {
                fd_local->version =
                     (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                     (uint)_i32[3];
                local_68 = 4;
              }
              else {
                fd_local->version =
                     (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                     (uint)_i32[3] << 4 | _i32[4] & 0xf;
                local_68 = 5;
              }
              local_64 = local_68;
            }
            local_60 = local_64;
          }
          local_5c = local_60;
        }
        _i32 = _i32 + local_5c;
      }
      if (*_i32 < 0x80) {
        *(uint *)&fd_local->file_def = (uint)*_i32;
        local_6c = 1;
      }
      else {
        if (*_i32 < 0xc0) {
          *(uint *)&fd_local->file_def = CONCAT11(*_i32,_i32[1]) & 0x3fff;
          local_70 = 2;
        }
        else {
          if (*_i32 < 0xe0) {
            *(uint *)&fd_local->file_def =
                 (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
            local_74 = 3;
          }
          else {
            if (*_i32 < 0xf0) {
              *(uint *)&fd_local->file_def =
                   (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                   (uint)_i32[3];
              local_78 = 4;
            }
            else {
              *(uint *)&fd_local->file_def =
                   (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                   (uint)_i32[3] << 4 | _i32[4] & 0xf;
              local_78 = 5;
            }
            local_74 = local_78;
          }
          local_70 = local_74;
        }
        local_6c = local_70;
      }
      _i32 = _i32 + local_6c;
      fd_local->header = (SAM_hdr *)0x0;
      if (fd->version >> 8 == 2) {
        if (*_i32 < 0x80) {
          local_38 = (uint)*_i32;
          local_7c = 1;
        }
        else {
          if (*_i32 < 0xc0) {
            local_38 = CONCAT11(*_i32,_i32[1]) & 0x3fff;
            local_80 = 2;
          }
          else {
            if (*_i32 < 0xe0) {
              local_38 = (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
              local_84 = 3;
            }
            else {
              if (*_i32 < 0xf0) {
                local_38 = (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                           (uint)_i32[3];
                local_88 = 4;
              }
              else {
                local_38 = (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                           (uint)_i32[3] << 4 | _i32[4] & 0xf;
                local_88 = 5;
              }
              local_84 = local_88;
            }
            local_80 = local_84;
          }
          local_7c = local_80;
        }
        _i32 = _i32 + local_7c;
        fd_local->header = (SAM_hdr *)(long)(int)local_38;
      }
      else if (2 < fd->version >> 8) {
        iVar1 = ltf8_get((char *)_i32,(int64_t *)&fd_local->header);
        _i32 = _i32 + iVar1;
      }
      if (*_i32 < 0x80) {
        *(uint *)&fd_local->prefix = (uint)*_i32;
        local_8c = 1;
      }
      else {
        if (*_i32 < 0xc0) {
          *(uint *)&fd_local->prefix = CONCAT11(*_i32,_i32[1]) & 0x3fff;
          local_90 = 2;
        }
        else {
          if (*_i32 < 0xe0) {
            *(uint *)&fd_local->prefix = (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2]
            ;
            local_94 = 3;
          }
          else {
            if (*_i32 < 0xf0) {
              *(uint *)&fd_local->prefix =
                   (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                   (uint)_i32[3];
              local_98 = 4;
            }
            else {
              *(uint *)&fd_local->prefix =
                   (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                   (uint)_i32[3] << 4 | _i32[4] & 0xf;
              local_98 = 5;
            }
            local_94 = local_98;
          }
          local_90 = local_94;
        }
        local_8c = local_90;
      }
      _i32 = _i32 + local_8c;
      if (*_i32 < 0x80) {
        *(uint *)((long)&fd_local->prefix + 4) = (uint)*_i32;
        local_9c = 1;
      }
      else {
        if (*_i32 < 0xc0) {
          *(uint *)((long)&fd_local->prefix + 4) = CONCAT11(*_i32,_i32[1]) & 0x3fff;
          local_a0 = 2;
        }
        else {
          if (*_i32 < 0xe0) {
            *(uint *)((long)&fd_local->prefix + 4) =
                 (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
            local_a4 = 3;
          }
          else {
            if (*_i32 < 0xf0) {
              *(uint *)((long)&fd_local->prefix + 4) =
                   (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                   (uint)_i32[3];
              local_a8 = 4;
            }
            else {
              *(uint *)((long)&fd_local->prefix + 4) =
                   (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                   (uint)_i32[3] << 4 | _i32[4] & 0xf;
              local_a8 = 5;
            }
            local_a4 = local_a8;
          }
          local_a0 = local_a4;
        }
        local_9c = local_a0;
      }
      _i32 = _i32 + local_9c;
      pvVar2 = malloc((long)*(int *)((long)&fd_local->prefix + 4) << 2);
      fd_local->record_counter = (int64_t)pvVar2;
      if (fd_local->record_counter == 0) {
        free(fd_local);
        fd_local = (cram_fd *)0x0;
      }
      else {
        for (local_34 = 0; local_34 < *(int *)((long)&fd_local->prefix + 4); local_34 = local_34 + 1
            ) {
          if (*_i32 < 0x80) {
            *(uint *)(fd_local->record_counter + (long)local_34 * 4) = (uint)*_i32;
            local_ac = 1;
          }
          else {
            if (*_i32 < 0xc0) {
              *(uint *)(fd_local->record_counter + (long)local_34 * 4) =
                   CONCAT11(*_i32,_i32[1]) & 0x3fff;
              local_b0 = 2;
            }
            else {
              if (*_i32 < 0xe0) {
                *(uint *)(fd_local->record_counter + (long)local_34 * 4) =
                     (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
                local_b4 = 3;
              }
              else {
                if (*_i32 < 0xf0) {
                  *(uint *)(fd_local->record_counter + (long)local_34 * 4) =
                       (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                       (uint)_i32[3];
                  local_b8 = 4;
                }
                else {
                  *(uint *)(fd_local->record_counter + (long)local_34 * 4) =
                       (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                       (uint)_i32[3] << 4 | _i32[4] & 0xf;
                  local_b8 = 5;
                }
                local_b4 = local_b8;
              }
              local_b0 = local_b4;
            }
            local_ac = local_b0;
          }
          _i32 = _i32 + local_ac;
        }
        if (b->content_type == MAPPED_SLICE) {
          if (*_i32 < 0x80) {
            fd_local->err = (uint)*_i32;
            local_bc = 1;
          }
          else {
            if (*_i32 < 0xc0) {
              fd_local->err = CONCAT11(*_i32,_i32[1]) & 0x3fff;
              local_c0 = 2;
            }
            else {
              if (*_i32 < 0xe0) {
                fd_local->err = (*_i32 & 0x1f) << 0x10 | (uint)_i32[1] << 8 | (uint)_i32[2];
                local_c4 = 3;
              }
              else {
                if (*_i32 < 0xf0) {
                  fd_local->err =
                       (*_i32 & 0xf) << 0x18 | (uint)_i32[1] << 0x10 | (uint)_i32[2] << 8 |
                       (uint)_i32[3];
                  local_c8 = 4;
                }
                else {
                  fd_local->err =
                       (uint)*_i32 << 0x1c | (uint)_i32[1] << 0x14 | (uint)_i32[2] << 0xc |
                       (uint)_i32[3] << 4 | _i32[4] & 0xf;
                  local_c8 = 5;
                }
                local_c4 = local_c8;
              }
              local_c0 = local_c4;
            }
            local_bc = local_c0;
          }
          _i32 = _i32 + local_bc;
        }
        if (fd->version >> 8 == 1) {
          memset(&fd_local->field_0x34,0,0x10);
        }
        else {
          *(undefined8 *)&fd_local->field_0x34 = *(undefined8 *)_i32;
          *(undefined8 *)((long)&fd_local->ctr + 4) = *(undefined8 *)(_i32 + 8);
        }
      }
    }
  }
  else {
    fd_local = (cram_fd *)0x0;
  }
  return (cram_block_slice_hdr *)fd_local;
}

Assistant:

cram_block_slice_hdr *cram_decode_slice_header(cram_fd *fd, cram_block *b) {
    cram_block_slice_hdr *hdr;
    char *cp = (char *)b->data;
    int i;

    if (b->content_type != MAPPED_SLICE &&
	b->content_type != UNMAPPED_SLICE)
	return NULL;

    if (!(hdr  = calloc(1, sizeof(*hdr))))
	return NULL;

    hdr->content_type = b->content_type;

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
    }
    cp += itf8_get(cp, &hdr->num_records);
    hdr->record_counter = 0;
    if (CRAM_MAJOR_VERS(fd->version) == 2) {
	int32_t i32;
	cp += itf8_get(cp, &i32);
	hdr->record_counter = i32;
    } else if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	cp += ltf8_get(cp, &hdr->record_counter);
    }

    cp += itf8_get(cp, &hdr->num_blocks);

    cp += itf8_get(cp, &hdr->num_content_ids);
    hdr->block_content_ids = malloc(hdr->num_content_ids * sizeof(int32_t));
    if (!hdr->block_content_ids) {
	free(hdr);
	return NULL;
    }

    for (i = 0; i < hdr->num_content_ids; i++) {
	cp += itf8_get(cp, &hdr->block_content_ids[i]);
    }

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_base_id);
    }

    if (CRAM_MAJOR_VERS(fd->version) != 1) {
	memcpy(hdr->md5, cp, 16);
    } else {
	memset(hdr->md5, 0, 16);
    }

    return hdr;
}